

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

ImGuiID __thiscall ImGuiWindow::GetIDNoKeepAlive(ImGuiWindow *this,void *ptr)

{
  ImGuiID IVar1;
  uint *puVar2;
  long in_RDI;
  ImGuiID id;
  ImGuiID seed;
  undefined1 local_10 [16];
  
  puVar2 = ImVector<unsigned_int>::back((ImVector<unsigned_int> *)(in_RDI + 200));
  IVar1 = ImHashData(local_10,8,*puVar2);
  return IVar1;
}

Assistant:

ImGuiID ImGuiWindow::GetIDNoKeepAlive(const void* ptr)
{
    ImGuiID seed = IDStack.back();
    ImGuiID id = ImHashData(&ptr, sizeof(void*), seed);
#ifdef IMGUI_ENABLE_TEST_ENGINE
    ImGuiContext& g = *GImGui;
    IMGUI_TEST_ENGINE_ID_INFO(id, ImGuiDataType_Pointer, ptr);
#endif
    return id;
}